

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

unique_ptr<perfetto::TracingService,_std::default_delete<perfetto::TracingService>_> __thiscall
perfetto::TracingService::CreateInstance
          (TracingService *this,
          unique_ptr<perfetto::SharedMemory::Factory,_std::default_delete<perfetto::SharedMemory::Factory>_>
          *shm_factory,TaskRunner *task_runner)

{
  TracingServiceImpl *this_00;
  unique_ptr<perfetto::SharedMemory::Factory,_std::default_delete<perfetto::SharedMemory::Factory>_>
  local_28;
  TaskRunner *local_20;
  TaskRunner *task_runner_local;
  unique_ptr<perfetto::SharedMemory::Factory,_std::default_delete<perfetto::SharedMemory::Factory>_>
  *shm_factory_local;
  
  local_20 = task_runner;
  task_runner_local = (TaskRunner *)shm_factory;
  shm_factory_local =
       (unique_ptr<perfetto::SharedMemory::Factory,_std::default_delete<perfetto::SharedMemory::Factory>_>
        *)this;
  this_00 = (TracingServiceImpl *)operator_new(0x228);
  std::
  unique_ptr<perfetto::SharedMemory::Factory,_std::default_delete<perfetto::SharedMemory::Factory>_>
  ::unique_ptr(&local_28,shm_factory);
  TracingServiceImpl::TracingServiceImpl(this_00,&local_28,local_20);
  ::std::unique_ptr<perfetto::TracingService,std::default_delete<perfetto::TracingService>>::
  unique_ptr<std::default_delete<perfetto::TracingService>,void>
            ((unique_ptr<perfetto::TracingService,std::default_delete<perfetto::TracingService>> *)
             this,(pointer)this_00);
  std::
  unique_ptr<perfetto::SharedMemory::Factory,_std::default_delete<perfetto::SharedMemory::Factory>_>
  ::~unique_ptr(&local_28);
  return (__uniq_ptr_data<perfetto::TracingService,_std::default_delete<perfetto::TracingService>,_true,_true>
          )(__uniq_ptr_data<perfetto::TracingService,_std::default_delete<perfetto::TracingService>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<TracingService> TracingService::CreateInstance(
    std::unique_ptr<SharedMemory::Factory> shm_factory,
    base::TaskRunner* task_runner) {
  return std::unique_ptr<TracingService>(
      new TracingServiceImpl(std::move(shm_factory), task_runner));
}